

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

uint Io_NtkWriteIntNode(FILE *pFile,Abc_Obj_t *pNode,int NodesOrPl)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int local_3c;
  int i;
  Abc_Obj_t *pNeto;
  Abc_Obj_t *pNeti;
  uint isize;
  uint sizey;
  uint sizex;
  int NodesOrPl_local;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  isize = 0;
  iVar1 = Abc_NtkHasMapping(pNode->pNtk);
  if (iVar1 == 0) {
    for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = Abc_ObjFanin(pNode,local_3c);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf((FILE *)pFile,"%s_",pcVar4);
    }
    for (local_3c = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = Abc_ObjFanout(pNode,local_3c);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf((FILE *)pFile,"%s_",pcVar4);
    }
    fprintf((FILE *)pFile,"name\t");
    if (NodesOrPl == 0) {
      uVar2 = Abc_ObjFaninNum(pNode);
      iVar1 = Abc_NodeIsConst0(pNode);
      if ((iVar1 == 0) && (iVar1 = Abc_NodeIsConst1(pNode), iVar1 == 0)) {
        iVar1 = Abc_NodeIsInv(pNode);
        if (iVar1 == 0) {
          iVar1 = Abc_NodeIsBuf(pNode);
          if (iVar1 == 0) {
            iVar1 = Abc_NtkHasSop(pNode->pNtk);
            if (iVar1 == 0) {
              __assert_fail("Abc_NtkHasSop(pNode->pNtk)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                            ,0x13e,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)");
            }
            iVar1 = Abc_NodeIsNand2(pNode);
            if ((iVar1 == 0) && (iVar1 = Abc_NodeIsNor2(pNode), iVar1 == 0)) {
              iVar1 = Abc_NodeIsAnd2(pNode);
              if ((iVar1 == 0) && (iVar1 = Abc_NodeIsOr2(pNode), iVar1 == 0)) {
                iVar1 = Abc_NodeIsXor2(pNode);
                if ((iVar1 == 0) && (iVar1 = Abc_NodeIsXnor2(pNode), iVar1 == 0)) {
                  if (uVar2 < 3) {
                    __assert_fail("isize > 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                                  ,0x147,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)"
                                 );
                  }
                  iVar1 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
                  isize = uVar2 + iVar1;
                }
                else {
                  isize = 5;
                }
              }
              else {
                isize = 3;
              }
            }
            else {
              isize = 2;
            }
          }
          else {
            isize = 2;
          }
        }
        else {
          isize = 1;
        }
      }
      else {
        isize = 0;
      }
    }
  }
  else {
    isize = Io_NtkWriteNodeGate(pFile,pNode);
  }
  if (NodesOrPl == 0) {
    fprintf((FILE *)pFile," %d %d\n",(ulong)isize,1);
    Abc_ObjFanoutNum(pNode);
  }
  return isize;
}

Assistant:

unsigned Io_NtkWriteIntNode( FILE * pFile, Abc_Obj_t * pNode, int NodesOrPl )
{
    unsigned sizex=0, sizey=coreHeight, isize=0;
    //double nx, ny, xstep, ystep;    
    Abc_Obj_t * pNeti, *pNeto;
    int i;
        
    // write the network after mapping 
    if ( Abc_NtkHasMapping(pNode->pNtk) )
        sizex=Io_NtkWriteNodeGate( pFile, pNode );
    else
    {
    Abc_ObjForEachFanin( pNode, pNeti, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeti) );
    Abc_ObjForEachFanout( pNode, pNeto, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeto) );    
    fprintf( pFile, "name\t" );
    
    if(NodesOrPl == NODES)
    {
        isize=Abc_ObjFaninNum(pNode);
        if ( Abc_NodeIsConst0(pNode) || Abc_NodeIsConst1(pNode) ) 
            sizex=0;
        else if ( Abc_NodeIsInv(pNode) )
            sizex=1;
        else if ( Abc_NodeIsBuf(pNode) )
            sizex=2;
        else
        {
            assert( Abc_NtkHasSop(pNode->pNtk) );
            if ( Abc_NodeIsNand2(pNode) || Abc_NodeIsNor2(pNode) )
            sizex=2;
        else if ( Abc_NodeIsAnd2(pNode) || Abc_NodeIsOr2(pNode) )
            sizex=3;
        else if ( Abc_NodeIsXor2(pNode) || Abc_NodeIsXnor2(pNode) )
            sizex=5;
        else
        {
            assert( isize > 2 );
            sizex=isize+Abc_SopGetCubeNum((char *)pNode->pData);
        }
        }
    }
    }
    if(NodesOrPl == NODES)
    {
    fprintf( pFile, " %d %d\n", sizex, sizey );

    // Equally place pins. Size pins needs /  isize+#output+1
    isize= isize + Abc_ObjFanoutNum(pNode) + 1;
    }
    return sizex*sizey;
    /*
    xstep = sizex / isize;
    ystep = sizey / isize;
    nx= -0.5 * sizex;
    ny= -0.5 * sizey;

    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    */
}